

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O2

bool __thiscall f8n::i18n::Locale::SetSelectedLocale(Locale *this,string *locale)

{
  element_type *peVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  string localeFn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [32];
  string local_50 [32];
  
  if ((this->defaultLocaleData).m_type == null) {
    std::operator+(&local_b0,&this->localePath,"/");
    std::operator+(&local_d0,&local_b0,"en_US");
    std::operator+(&local_f8,&local_d0,".json");
    loadLocaleData((string *)(local_70 + 0x10));
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&this->defaultLocaleData,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(local_70 + 0x10));
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(local_70 + 0x10));
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  __it._M_current =
       (this->locales).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (this->locales).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_50,(string *)locale);
  std::__cxx11::string::string((string *)&local_b0,local_50);
  std::__cxx11::string::string((string *)&local_f8,(string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string((string *)&local_f8,(string *)&local_d0);
  lVar5 = (long)local_d8 - (long)__it._M_current;
  for (lVar3 = lVar5 >> 7; _Var4._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                        *)&local_f8,__it);
    if (bVar2) goto LAB_001c4845;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                        *)&local_f8,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001c4845;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                        *)&local_f8,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001c4845;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                        *)&local_f8,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001c4845;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = local_d8;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                                *)&local_f8,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_001c4845;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                        *)&local_f8,_Var4);
    if (bVar2) goto LAB_001c4845;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                      *)&local_f8,__it);
  _Var4._M_current = local_d8;
  if (bVar2) {
    _Var4._M_current = __it._M_current;
  }
LAB_001c4845:
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_50);
  if (_Var4._M_current !=
      (this->locales).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&local_b0,&this->localePath,"/");
    std::operator+(&local_d0,&local_b0,locale);
    std::operator+(&local_f8,&local_d0,".json");
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    loadLocaleData((string *)local_70);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&this->localeData,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_70);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_70);
    if ((this->localeData).m_type != null) {
      std::__cxx11::string::_M_assign((string *)&this->selectedLocale);
      peVar1 = (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*(peVar1->super_IPreferences)._vptr_IPreferences[8])
                (peVar1,"default",(this->selectedLocale)._M_dataplus._M_p);
      (*(((this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_IPreferences)._vptr_IPreferences[9])();
      std::__cxx11::string::string((string *)&local_90,(string *)&this->selectedLocale);
      sigslot::
      signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
      ::operator()(&this->LocaleChanged,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f8);
      return true;
    }
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return false;
}

Assistant:

bool Locale::SetSelectedLocale(const std::string& locale) {
    if (this->defaultLocaleData.is_null()) {
        this->defaultLocaleData = loadLocaleData(localePath + "/" + DEFAULT_LOCALE + ".json");
    }

    auto it = std::find_if(
        this->locales.begin(),
        this->locales.end(),
        [locale](std::string compare) {
            return locale == compare;
        });

    if (it != this->locales.end()) {
        std::string localeFn = this->localePath + "/" + locale + ".json";
        this->localeData = loadLocaleData(localeFn);

        if (!this->localeData.is_null()) {
            this->selectedLocale = locale;

            prefs->SetString(PREFERENCE_KEY_LOCALE, this->selectedLocale.c_str());
            prefs->Save();

            this->LocaleChanged(this->selectedLocale);
            return true;
        }
    }

    return false;
}